

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O3

void jinit_master_decompress(j_decompress_ptr cinfo)

{
  JSAMPLE *pJVar1;
  jpeg_error_mgr *pjVar2;
  boolean bVar3;
  jpeg_decomp_master *pjVar4;
  void *__s;
  uint need_full_buffer;
  long lVar5;
  JSAMPLE JVar6;
  JSAMPLE JVar7;
  JSAMPLE JVar8;
  JSAMPLE JVar9;
  JSAMPLE JVar10;
  JSAMPLE JVar11;
  JSAMPLE JVar12;
  JSAMPLE JVar13;
  JSAMPLE JVar14;
  JSAMPLE JVar15;
  JSAMPLE JVar16;
  JSAMPLE JVar17;
  JSAMPLE JVar18;
  JSAMPLE JVar19;
  JSAMPLE JVar20;
  JSAMPLE JVar21;
  
  pjVar4 = (jpeg_decomp_master *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x30);
  cinfo->master = pjVar4;
  pjVar4->prepare_for_output_pass = prepare_for_output_pass;
  pjVar4->finish_output_pass = finish_output_pass;
  pjVar4->is_dummy_pass = 0;
  jpeg_calc_output_dimensions(cinfo);
  __s = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x580);
  cinfo->sample_range_limit = (JSAMPLE *)((long)__s + 0x100);
  lVar5 = 0;
  memset(__s,0,0x100);
  JVar6 = '\0';
  JVar7 = '\x01';
  JVar8 = '\x02';
  JVar9 = '\x03';
  JVar10 = '\x04';
  JVar11 = '\x05';
  JVar12 = '\x06';
  JVar13 = '\a';
  JVar14 = '\b';
  JVar15 = '\t';
  JVar16 = '\n';
  JVar17 = '\v';
  JVar18 = '\f';
  JVar19 = '\r';
  JVar20 = '\x0e';
  JVar21 = '\x0f';
  do {
    pJVar1 = (JSAMPLE *)((long)__s + 0x100) + lVar5;
    *pJVar1 = JVar6;
    pJVar1[1] = JVar7;
    pJVar1[2] = JVar8;
    pJVar1[3] = JVar9;
    pJVar1[4] = JVar10;
    pJVar1[5] = JVar11;
    pJVar1[6] = JVar12;
    pJVar1[7] = JVar13;
    pJVar1[8] = JVar14;
    pJVar1[9] = JVar15;
    pJVar1[10] = JVar16;
    pJVar1[0xb] = JVar17;
    pJVar1[0xc] = JVar18;
    pJVar1[0xd] = JVar19;
    pJVar1[0xe] = JVar20;
    pJVar1[0xf] = JVar21;
    lVar5 = lVar5 + 0x10;
    JVar6 = JVar6 + '\x10';
    JVar7 = JVar7 + '\x10';
    JVar8 = JVar8 + '\x10';
    JVar9 = JVar9 + '\x10';
    JVar10 = JVar10 + '\x10';
    JVar11 = JVar11 + '\x10';
    JVar12 = JVar12 + '\x10';
    JVar13 = JVar13 + '\x10';
    JVar14 = JVar14 + '\x10';
    JVar15 = JVar15 + '\x10';
    JVar16 = JVar16 + '\x10';
    JVar17 = JVar17 + '\x10';
    JVar18 = JVar18 + '\x10';
    JVar19 = JVar19 + '\x10';
    JVar20 = JVar20 + '\x10';
    JVar21 = JVar21 + '\x10';
  } while (lVar5 != 0x100);
  memset((void *)((long)__s + 0x200),0xff,0x180);
  memset((void *)((long)__s + 0x380),0,0x180);
  memcpy((void *)((long)__s + 0x500),cinfo->sample_range_limit,0x80);
  if ((long)cinfo->out_color_components * (ulong)cinfo->output_width >> 0x20 != 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x48;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  *(undefined4 *)&pjVar4[1].prepare_for_output_pass = 0;
  bVar3 = use_merged_upsample(cinfo);
  *(boolean *)((long)&pjVar4[1].prepare_for_output_pass + 4) = bVar3;
  pjVar4[1].finish_output_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar4[1].is_dummy_pass = 0;
  *(undefined4 *)&pjVar4[1].field_0x14 = 0;
  if (cinfo->quantize_colors == 0) {
    cinfo->enable_1pass_quant = 0;
    cinfo->enable_external_quant = 0;
    cinfo->enable_2pass_quant = 0;
  }
  else {
    if (cinfo->buffered_image == 0) {
      cinfo->enable_1pass_quant = 0;
      cinfo->enable_external_quant = 0;
      cinfo->enable_2pass_quant = 0;
    }
    if (cinfo->raw_data_out != 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x30;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->out_color_components == 3) {
      if (cinfo->colormap == (JSAMPARRAY)0x0) {
        if (cinfo->two_pass_quantize == 0) {
          cinfo->enable_1pass_quant = 1;
        }
        else {
          cinfo->enable_2pass_quant = 1;
        }
      }
      else {
        cinfo->enable_external_quant = 1;
      }
    }
    else {
      cinfo->enable_1pass_quant = 1;
      cinfo->enable_external_quant = 0;
      cinfo->enable_2pass_quant = 0;
      cinfo->colormap = (JSAMPARRAY)0x0;
    }
    if (cinfo->enable_1pass_quant != 0) {
      jinit_1pass_quantizer(cinfo);
      pjVar4[1].finish_output_pass = (_func_void_j_decompress_ptr *)cinfo->cquantize;
    }
    if ((cinfo->enable_2pass_quant != 0) || (cinfo->enable_external_quant != 0)) {
      jinit_2pass_quantizer(cinfo);
      *(jpeg_color_quantizer **)&pjVar4[1].is_dummy_pass = cinfo->cquantize;
    }
  }
  if (cinfo->raw_data_out == 0) {
    if (*(int *)((long)&pjVar4[1].prepare_for_output_pass + 4) == 0) {
      jinit_color_deconverter(cinfo);
      jinit_upsampler(cinfo);
    }
    else {
      jinit_merged_upsampler(cinfo);
    }
    jinit_d_post_controller(cinfo,cinfo->enable_2pass_quant);
  }
  jinit_inverse_dct(cinfo);
  if (cinfo->arith_code == 0) {
    jinit_huff_decoder(cinfo);
  }
  else {
    jinit_arith_decoder(cinfo);
  }
  need_full_buffer = 1;
  if (cinfo->inputctl->has_multiple_scans == 0) {
    need_full_buffer = (uint)(cinfo->buffered_image != 0);
  }
  jinit_d_coef_controller(cinfo,need_full_buffer);
  if (cinfo->raw_data_out == 0) {
    jinit_d_main_controller(cinfo,0);
  }
  (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
  (*cinfo->inputctl->start_input_pass)(cinfo);
  return;
}

Assistant:

GLOBAL(void)
jinit_master_decompress (j_decompress_ptr cinfo)
{
  my_master_ptr master;

  master = (my_master_ptr)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(my_decomp_master));
  cinfo->master = (struct jpeg_decomp_master *) master;
  master->pub.prepare_for_output_pass = prepare_for_output_pass;
  master->pub.finish_output_pass = finish_output_pass;

  master->pub.is_dummy_pass = FALSE;

  master_selection(cinfo);
}